

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O2

Tru_Man_t * Tru_ManAlloc(int nVars)

{
  int iVar1;
  Tru_Man_t *p;
  int *piVar2;
  Vec_Set_t *pVVar3;
  word **ppwVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  word local_68 [7];
  
  local_68[0] = 0xaaaaaaaaaaaaaaaa;
  local_68[1] = 0xcccccccccccccccc;
  local_68[2] = 0xf0f0f0f0f0f0f0f0;
  local_68[3] = 0xff00ff00ff00ff00;
  local_68[4] = 0xffff0000ffff0000;
  local_68[5] = 0xffffffff00000000;
  if (0xf < nVars - 1U) {
    __assert_fail("nVars > 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                  ,0xd3,"Tru_Man_t *Tru_ManAlloc(int)");
  }
  uVar8 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if ((uint)nVars < 6) {
    uVar8 = 1;
  }
  p = (Tru_Man_t *)calloc(1,0x70);
  p->nVars = nVars;
  p->nWords = (int)uVar8;
  p->nEntrySize = (int)(uVar8 * 8 + 8 >> 2);
  p->nTableSize = 0x1fd3;
  piVar2 = (int *)calloc(0x1fd3,4);
  p->pTable = piVar2;
  pVVar3 = (Vec_Set_t *)calloc(1,0x20);
  pVVar3->nPageSize = 0x10;
  pVVar3->uPageMask = 0xffff;
  pVVar3->nPagesAlloc = 0x100;
  ppwVar4 = (word **)calloc(0x100,8);
  pVVar3->pPages = ppwVar4;
  pwVar5 = (word *)malloc(0x80000);
  pwVar5[1] = 0xffffffffffffffff;
  *ppwVar4 = pwVar5;
  *pwVar5 = 2;
  p->pMem = pVVar3;
  pwVar5 = (word *)malloc(uVar8 << 3);
  p->pZero = pwVar5;
  uVar8 = 0;
  while( true ) {
    if (uVar8 == (uint)nVars) {
      pwVar5 = p->pZero;
      uVar7 = 0;
      uVar8 = (ulong)(uint)p->nWords;
      if (p->nWords < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pwVar5[uVar7] = 0;
      }
      return p;
    }
    uVar7 = (ulong)(uint)p->nWords;
    if (p->nWords < 1) {
      uVar7 = 0;
    }
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      if (uVar8 < 6) {
        p->pZero[uVar6] = local_68[uVar8];
      }
      else if ((1 << ((char)uVar8 - 6U & 0x1f) & (uint)uVar6) == 0) {
        p->pZero[uVar6] = 0;
      }
      else {
        p->pZero[uVar6] = 0xffffffffffffffff;
      }
    }
    iVar1 = Tru_ManInsert(p,p->pZero);
    p->hIthVars[uVar8] = iVar1;
    if ((uVar8 != 0) && (iVar1 <= p->hIthVars[uVar8 - 1])) break;
    uVar8 = uVar8 + 1;
  }
  __assert_fail("!i || p->hIthVars[i] > p->hIthVars[i-1]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satTruth.c"
                ,0xe7,"Tru_Man_t *Tru_ManAlloc(int)");
}

Assistant:

Tru_Man_t * Tru_ManAlloc( int nVars )
{
    word Masks[6] = 
    { 
        ABC_CONST(0xAAAAAAAAAAAAAAAA), 
        ABC_CONST(0xCCCCCCCCCCCCCCCC), 
        ABC_CONST(0xF0F0F0F0F0F0F0F0), 
        ABC_CONST(0xFF00FF00FF00FF00), 
        ABC_CONST(0xFFFF0000FFFF0000), 
        ABC_CONST(0xFFFFFFFF00000000) 
    };
    Tru_Man_t * p;
    int i, w;
    assert( nVars > 0 && nVars <= 16 );
    p = ABC_CALLOC( Tru_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = (nVars < 6) ? 1 : (1 << (nVars-6));
    p->nEntrySize = (sizeof(Tru_One_t) + p->nWords * sizeof(word))/sizeof(int);
    p->nTableSize = 8147;
    p->pTable     = ABC_CALLOC( int, p->nTableSize );
    p->pMem       = Vec_SetAlloc( 16 );
    // initialize truth tables
    p->pZero = ABC_ALLOC( word, p->nWords );
    for ( i = 0; i < nVars; i++ )
    {
        for ( w = 0; w < p->nWords; w++ )
            if ( i < 6 )
                p->pZero[w] = Masks[i];
            else if ( w & (1 << (i-6)) )
                p->pZero[w] = ~(word)0;
            else
                p->pZero[w] = 0;
        p->hIthVars[i] = Tru_ManInsert( p, p->pZero );
        assert( !i || p->hIthVars[i] > p->hIthVars[i-1] );
    }
    Tru_ManClear( p->pZero, p->nWords );
    return p;
}